

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O2

void duckdb::CreateColumnDependencyManager(BoundCreateTableInfo *info)

{
  bool bVar1;
  pointer pCVar2;
  ColumnDefinition *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  ColumnListIterator CVar3;
  ColumnLogicalIteratorInternal __begin1;
  ColumnLogicalIteratorInternal __end1;
  ColumnLogicalIteratorInternal local_70;
  ColumnLogicalIteratorInternal local_50;
  ColumnListIterator local_30;
  
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&info->base);
  this_00 = &pCVar2[1].catalog.field_2;
  CVar3 = ColumnList::Logical((ColumnList *)this_00);
  local_30.list = CVar3.list;
  local_30.physical = CVar3.physical;
  ColumnList::ColumnListIterator::begin(&local_70,&local_30);
  ColumnList::ColumnListIterator::end(&local_50,&local_30);
  while (((local_70.pos != local_50.pos || (local_70.end != local_50.end)) ||
         (local_70.list != local_50.list))) {
    this = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_70);
    bVar1 = ColumnDefinition::Generated(this);
    if (bVar1) {
      ColumnDependencyManager::AddGeneratedColumn
                (&info->column_dependency_manager,this,(ColumnList *)this_00);
    }
    local_70.pos = local_70.pos + 1;
  }
  return;
}

Assistant:

static void CreateColumnDependencyManager(BoundCreateTableInfo &info) {
	auto &base = info.base->Cast<CreateTableInfo>();
	for (auto &col : base.columns.Logical()) {
		if (!col.Generated()) {
			continue;
		}
		info.column_dependency_manager.AddGeneratedColumn(col, base.columns);
	}
}